

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_rayquery_function
          (CompilerHLSL *this,char *commited,char *candidate,uint32_t *ops)

{
  uint32_t result_type;
  uint32_t result_id;
  char **ts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  string local_70;
  string local_50;
  uint32_t local_2c;
  uint32_t *puStack_28;
  uint32_t is_commited;
  uint32_t *ops_local;
  char *candidate_local;
  char *commited_local;
  CompilerHLSL *this_local;
  
  puStack_28 = ops;
  ops_local = (uint32_t *)candidate;
  candidate_local = commited;
  commited_local = (char *)this;
  CompilerGLSL::flush_variable_declaration(&this->super_CompilerGLSL,*ops);
  local_2c = Compiler::evaluate_constant_u32((Compiler *)this,puStack_28[3]);
  result_type = *puStack_28;
  result_id = puStack_28[1];
  ts_1 = (char **)&DAT_00000001;
  CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,puStack_28[2],true);
  if (local_2c == 0) {
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ops_local;
  }
  else {
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&candidate_local
    ;
  }
  join<std::__cxx11::string,char_const*&>(&local_50,(spirv_cross *)&local_70,local_98,ts_1);
  CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,result_id,&local_50,false,false);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void CompilerHLSL::emit_rayquery_function(const char *commited, const char *candidate, const uint32_t *ops)
{
	flush_variable_declaration(ops[0]);
	uint32_t is_commited = evaluate_constant_u32(ops[3]);
	emit_op(ops[0], ops[1], join(to_expression(ops[2]), is_commited ? commited : candidate), false);
}